

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.cpp
# Opt level: O3

void __thiscall SpecificStrategy::process(SpecificStrategy *this)

{
  CFG *a;
  Addr addr;
  long lVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  CFG *b;
  ostream *poVar5;
  long *plVar6;
  _Rb_tree_node_base *p_Var7;
  int iVar8;
  int iVar9;
  int iVar10;
  SpecificStrategy *this_00;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  Stats bStats;
  Stats aStats;
  Report report;
  int local_5e8;
  int local_5e4;
  int local_5e0;
  int local_5dc;
  int local_5d8;
  int local_5d4;
  int local_5d0;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  int local_5b4;
  Stats local_5b0;
  Stats local_580;
  ostream *local_550;
  int local_544;
  int local_540;
  int local_53c;
  int local_538;
  int local_534;
  int local_530;
  int local_52c;
  int local_528;
  int local_524;
  int local_520;
  int local_51c;
  undefined8 local_518;
  undefined8 uStack_510;
  ulong local_500;
  int local_4f8;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  int local_4e8;
  int local_4e4;
  int local_4e0;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  int local_4d0;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  Stats local_4b8;
  Stats local_488;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined1 *local_430;
  _Rb_tree_node_base *local_428;
  _Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_> local_420;
  Report local_3f0;
  
  local_5b0._vptr_Stats = (_func_int **)&PTR__Stats_00117cf8;
  local_5b0.instrs = 0;
  local_5b0.blocks.perfect = 0;
  local_5b0.blocks.conflict = 0;
  local_5b0.phantoms = 0;
  local_5b0.edges.internal.perfect = 0;
  local_5b0.edges.internal.conflict = 0;
  local_5b0.edges.external.perfect = 0;
  local_5b0.edges.external.conflict = 0;
  uVar13 = 0;
  local_5b0.calls = 0;
  local_5b0.indirects = 0;
  local_580._vptr_Stats = (_func_int **)&PTR__Stats_00117cf8;
  local_580.instrs = 0;
  local_580.blocks.perfect = 0;
  local_580.blocks.conflict = 0;
  local_580.phantoms = 0;
  local_580.edges.internal.perfect = 0;
  local_580.edges.internal.conflict = 0;
  local_580.edges.external.perfect = 0;
  local_580.edges.external.conflict = 0;
  local_580.calls = 0;
  local_580.indirects = 0;
  local_550 = (ostream *)&(this->super_Strategy).m_fout;
  local_430 = &(this->super_Strategy).field_0xd8;
  cVar2 = std::__basic_file<char>::is_open();
  poVar5 = local_550;
  if (cVar2 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_550,"cfg,type,instrs,blocks_perfect,blocks_conflict,",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"phantoms,",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"edges_internal_perfect,edges_internal_conflict,",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"edges_external_perfect,edges_external_conflict,",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"calls,indirect",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  CFGsContainer::cfgs((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&local_420,
                      (this->super_Strategy).m_a);
  local_5b4 = 0;
  if ((_Rb_tree_header *)local_420._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_420._M_impl.super__Rb_tree_header) {
    local_5dc = local_5b0.edges.internal.conflict;
    local_5d8 = local_5b0.edges.external.perfect;
    local_5d4 = local_5b0.edges.external.conflict;
    local_5d0 = local_5b0.calls;
    local_5cc = local_5b0.indirects;
    local_5c8 = local_580.instrs;
    local_5c4 = local_580.blocks.perfect;
    local_5e8 = local_580.blocks.conflict;
    local_518 = CONCAT44(local_580.edges.internal.perfect,local_580.phantoms);
    uStack_510 = CONCAT44(local_580.edges.external.perfect,local_580.edges.internal.conflict);
    local_5e4 = local_580.edges.external.conflict;
    local_458 = 0;
    uStack_450 = 0;
    local_51c = 0;
    local_5e0 = local_580.calls;
    local_448 = 0;
    uStack_440 = 0;
    local_520 = 0;
    local_524 = 0;
    local_528 = 0;
    local_52c = 0;
    local_534 = 0;
    local_530 = 0;
    local_538 = 0;
    local_53c = 0;
    local_540 = 0;
    local_544 = 0;
    local_5b4 = 0;
    uVar13 = 0;
    p_Var7 = local_420._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      a = *(CFG **)(p_Var7 + 1);
      if (a->m_status == VALID) {
        addr = a->m_addr;
        bVar3 = Strategy::isAddrInRange(&this->super_Strategy,addr);
        if (bVar3) {
          b = CFGsContainer::cfg((this->super_Strategy).m_b,addr);
          if ((b != (CFG *)0x0) && (b->m_status == VALID)) {
            this_00 = this;
            compareCFGs(&local_3f0,this,a,b);
            extractStats(&local_488,this_00,&local_3f0.present);
            local_500 = uVar13;
            extractStats(&local_4b8,this_00,&local_3f0.missing);
            if ((this->super_Strategy).m_config.detailed == true) {
              *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                   *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5
                   | 8;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CFG 0x",6);
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
              std::ostream::put((char)poVar5);
              std::ostream::flush();
              *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                   *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5
                   | 2;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"present: ",9);
              operator<<((ostream *)&std::cout,&local_488);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
              std::ostream::put(-0x18);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"missing: ",9);
              operator<<((ostream *)&std::cout,&local_4b8);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
              std::ostream::put(-0x18);
              std::ostream::flush();
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
              std::ostream::put(-0x18);
              std::ostream::flush();
            }
            cVar2 = std::__basic_file<char>::is_open();
            local_5e4 = local_4b8.edges.external.conflict;
            iVar10 = local_4b8.indirects;
            iVar4 = local_488.instrs;
            iVar8 = local_488.edges.internal.conflict;
            iVar9 = local_488.edges.external.perfect;
            iVar12 = local_488.edges.external.conflict;
            local_5d0 = local_488.calls;
            local_5cc = local_488.indirects;
            iVar11 = local_4b8.instrs;
            local_5c4 = local_4b8.blocks.perfect;
            local_5e8 = local_4b8.blocks.conflict;
            local_5e0 = local_4b8.calls;
            iVar14 = local_488.blocks.perfect;
            iVar15 = local_488.blocks.conflict;
            iVar16 = local_488.phantoms;
            iVar17 = local_488.edges.internal.perfect;
            iVar18 = local_4b8.phantoms;
            iVar19 = local_4b8.edges.internal.perfect;
            iVar20 = local_4b8.edges.internal.conflict;
            iVar21 = local_4b8.edges.external.perfect;
            local_428 = p_Var7;
            if (cVar2 != '\0') {
              std::__ostream_insert<char,std::char_traits<char>>(local_550,"0x",2);
              lVar1 = *(long *)(*(long *)&(this->super_Strategy).m_fout + -0x18);
              *(uint *)(&(this->super_Strategy).field_0x80 + lVar1) =
                   *(uint *)(&(this->super_Strategy).field_0x80 + lVar1) & 0xffffffb5 | 8;
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_550);
              *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
                   *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",present,",9);
              local_4bc = local_488.instrs;
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_488.instrs);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              local_4c0 = local_488.blocks.perfect;
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_488.blocks.perfect);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              local_4c4 = local_488.blocks.conflict;
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_488.blocks.conflict);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              local_4c8 = local_488.phantoms;
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_488.phantoms);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              local_4cc = local_488.edges.internal.perfect;
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_488.edges.internal.perfect);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              local_4d0 = local_488.edges.internal.conflict;
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_488.edges.internal.conflict)
              ;
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              local_4d4 = local_488.edges.external.perfect;
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_488.edges.external.perfect);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              local_4d8 = local_488.edges.external.conflict;
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_488.edges.external.conflict)
              ;
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              local_4dc = local_488.calls;
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_488.calls);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              local_4e0 = local_488.indirects;
              plVar6 = (long *)std::ostream::operator<<((ostream *)poVar5,local_488.indirects);
              std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
              std::ostream::put((char)plVar6);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>(local_550,"0x",2);
              lVar1 = *(long *)(*(long *)&(this->super_Strategy).m_fout + -0x18);
              *(uint *)(&(this->super_Strategy).field_0x80 + lVar1) =
                   *(uint *)(&(this->super_Strategy).field_0x80 + lVar1) & 0xffffffb5 | 8;
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_550);
              *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
                   *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",missing,",9);
              local_4e4 = local_4b8.instrs;
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_4b8.instrs);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              local_4e8 = local_4b8.blocks.perfect;
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_4b8.blocks.perfect);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              local_4ec = local_4b8.blocks.conflict;
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_4b8.blocks.conflict);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              local_4f0 = local_4b8.phantoms;
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_4b8.phantoms);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              local_4f4 = local_4b8.edges.internal.perfect;
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_4b8.edges.internal.perfect);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              iVar20 = local_4b8.edges.internal.conflict;
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_4b8.edges.internal.conflict)
              ;
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              iVar21 = local_4b8.edges.external.perfect;
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_4b8.edges.external.perfect);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              local_5e4 = local_4b8.edges.external.conflict;
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,local_4b8.edges.external.conflict)
              ;
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              local_4f8 = local_4b8.calls;
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_4b8.calls);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
              iVar10 = local_4b8.indirects;
              plVar6 = (long *)std::ostream::operator<<((ostream *)poVar5,local_4b8.indirects);
              std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
              std::ostream::put((char)plVar6);
              std::ostream::flush();
              iVar4 = local_4bc;
              iVar8 = local_4d0;
              iVar9 = local_4d4;
              iVar12 = local_4d8;
              local_5d0 = local_4dc;
              local_5cc = local_4e0;
              iVar11 = local_4e4;
              local_5c4 = local_4e8;
              local_5e8 = local_4ec;
              local_5e0 = local_4f8;
              iVar14 = local_4c0;
              iVar15 = local_4c4;
              iVar16 = local_4c8;
              iVar17 = local_4cc;
              iVar18 = local_4f0;
              iVar19 = local_4f4;
            }
            local_500 = (ulong)(uint)((int)local_500 + iVar4);
            local_544 = local_544 + iVar8;
            local_540 = local_540 + iVar9;
            local_53c = local_53c + iVar12;
            local_5d0 = local_538 + local_5d0;
            local_5cc = local_530 + local_5cc;
            local_534 = local_534 + iVar11;
            local_5c4 = local_52c + local_5c4;
            local_5e8 = local_528 + local_5e8;
            local_5e4 = local_524 + local_5e4;
            local_5e0 = local_520 + local_5e0;
            local_51c = local_51c + iVar10;
            local_458 = CONCAT44(local_458._4_4_ + iVar15,(int)local_458 + iVar14);
            uStack_450 = CONCAT44(uStack_450._4_4_ + iVar17,(int)uStack_450 + iVar16);
            local_448 = CONCAT44(local_448._4_4_ + iVar19,(int)local_448 + iVar18);
            uStack_440 = CONCAT44(uStack_440._4_4_ + iVar21,(int)uStack_440 + iVar20);
            local_580.indirects = local_51c;
            local_5b4 = local_5b4 + 1;
            Report::~Report(&local_3f0);
            local_518 = local_448;
            uStack_510 = uStack_440;
            local_5c8 = local_534;
            local_5d4 = local_53c;
            local_5d8 = local_540;
            local_5dc = local_544;
            p_Var7 = local_428;
            uVar13 = local_500;
            local_538 = local_5d0;
            local_530 = local_5cc;
            local_52c = local_5c4;
            local_528 = local_5e8;
            local_524 = local_5e4;
            local_520 = local_5e0;
          }
        }
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != &local_420._M_impl.super__Rb_tree_header);
    local_580.phantoms = (int)local_518;
    local_580.edges.internal.perfect = (int)((ulong)local_518 >> 0x20);
    local_580.edges.internal.conflict = (int)uStack_510;
    local_580.edges.external.perfect = (int)((ulong)uStack_510 >> 0x20);
    local_580.edges.external.conflict = local_5e4;
    local_580.calls = local_5e0;
    local_5b0.edges.internal.conflict = local_5dc;
    local_5b0.edges.external.conflict = local_5d4;
    local_5b0.edges.external.perfect = local_5d8;
    local_5b0.indirects = local_5cc;
    local_5b0.calls = local_5d0;
    local_580.blocks.perfect = local_5c4;
    local_580.instrs = local_5c8;
    local_580.blocks.conflict = local_5e8;
    local_5b0.blocks.perfect = (int)local_458;
    local_5b0.blocks.conflict = (int)((ulong)local_458 >> 0x20);
    local_5b0.phantoms = (int)uStack_450;
    local_5b0.edges.internal.perfect = (int)((ulong)uStack_450 >> 0x20);
  }
  local_5b0.instrs = (int)uVar13;
  std::_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>::
  ~_Rb_tree(&local_420);
  if ((this->super_Strategy).m_config.detailed != false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total: ",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"present: cfgs(",0xe);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_5b4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"), ",3);
  operator<<(poVar5,&local_5b0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"missing: cfgs(0), ",0x12);
  operator<<((ostream *)&std::cout,&local_580);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return;
}

Assistant:

void SpecificStrategy::process() {
	struct {
		SpecificStrategy::Stats present, missing;
	} total;

	if (m_fout.is_open())
		m_fout << "cfg,type,instrs,blocks_perfect,blocks_conflict,"
		       << "phantoms,"
		       << "edges_internal_perfect,edges_internal_conflict,"
			   << "edges_external_perfect,edges_external_conflict,"
			   << "calls,indirect" << std::endl;

	int cfgs = 0;
	for (CFG* aCFG : m_a->cfgs()) {
		if (aCFG->status() != CFG::VALID)
			continue;

		Addr addr = aCFG->addr();
		if (!this->isAddrInRange(addr))
			continue;

		CFG* bCFG = m_b->cfg(addr);
		if (bCFG == 0 || bCFG->status() != CFG::VALID)
			continue;

		SpecificStrategy::Report report = compareCFGs(aCFG, bCFG);

		SpecificStrategy::Stats aStats = this->extractStats(report.present);
		SpecificStrategy::Stats bStats = this->extractStats(report.missing);

		if (m_config.detailed) {
			std::cout << std::hex;
			std::cout << "CFG 0x" << aCFG->addr() << std::endl;
			std::cout << std::dec;
			std::cout << "present: " << aStats << std::endl;
			std::cout << "missing: " << bStats << std::endl;
			std::cout << std::endl;
		}

		if (m_fout.is_open()) {
			m_fout << "0x" << std::hex << aCFG->addr() << std::dec
					<< ",present," << aStats.instrs << ","
					<< aStats.blocks.perfect << "," << aStats.blocks.conflict << ","
					<< aStats.phantoms << ","
					<< aStats.edges.internal.perfect << "," << aStats.edges.internal.conflict << ","
					<< aStats.edges.external.perfect << "," << aStats.edges.external.conflict << ","
					<< aStats.calls << "," << aStats.indirects << std::endl;

			m_fout << "0x" << std::hex << bCFG->addr() << std::dec
					<< ",missing," << bStats.instrs << ","
					<< bStats.blocks.perfect << "," << bStats.blocks.conflict << ","
					<< bStats.phantoms << ","
					<< bStats.edges.internal.perfect << "," << bStats.edges.internal.conflict << ","
					<< bStats.edges.external.perfect << "," << bStats.edges.external.conflict << ","
					<< bStats.calls << "," << bStats.indirects << std::endl;
		}

		total.present += aStats;
		total.missing += bStats;

		cfgs++;
	}

	if (m_config.detailed)
		std::cout << "Total: " << std::endl;
	std::cout << "present: cfgs(" << cfgs << "), " << total.present << std::endl;
	std::cout << "missing: cfgs(0), " << total.missing << std::endl;
}